

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar2;
  typed_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
  *ptVar3;
  size_type sVar4;
  ostream *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  bool bVar5;
  exception *error;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> filename;
  variables_map vm;
  options_description desc;
  string *in_stack_fffffffffffffc78;
  options_description *in_stack_fffffffffffffc80;
  key_type *in_stack_fffffffffffffc88;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  *in_stack_fffffffffffffc90;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *in_stack_fffffffffffffd58;
  undefined8 in_stack_fffffffffffffd60;
  int style;
  anon_class_8_1_3fcf6775 in_stack_fffffffffffffd68;
  char **in_stack_fffffffffffffd70;
  int in_stack_fffffffffffffd7c;
  allocator local_271;
  string local_270 [32];
  string local_250 [39];
  allocator local_229;
  string local_228 [32];
  undefined4 local_208;
  byte local_203;
  byte local_202;
  allocator local_201;
  string local_200 [39];
  allocator local_1d9;
  string local_1d8 [32];
  variables_map *vm_00;
  ostream *output;
  basic_parsed_options local_198 [40];
  variables_map local_170 [112];
  function<void_(std::basic_fstream<char,_std::char_traits<char>_>_&)> *in_stack_ffffffffffffff00;
  openmode in_stack_ffffffffffffff0c;
  string *in_stack_ffffffffffffff10;
  undefined8 local_d0 [3];
  allocator local_b1;
  string local_b0 [32];
  options_description local_90 [140];
  int local_4;
  
  style = (int)((ulong)in_stack_fffffffffffffd60 >> 0x20);
  local_4 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"Allowed options",&local_b1);
  boost::program_options::options_description::options_description
            (local_90,local_b0,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  local_d0[0] = boost::program_options::options_description::add_options();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_d0,"help,h");
  ptVar2 = boost::program_options::value<std::__cxx11::string>();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"output,o",(char *)ptVar2);
  ptVar2 = boost::program_options::value<std::__cxx11::string>();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"namespace,n",(char *)ptVar2);
  ptVar3 = boost::program_options::
           value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  boost::program_options::options_description_easy_init::operator()
            (pcVar1,(value_semantic *)"input,i",(char *)ptVar3);
  boost::program_options::variables_map::variables_map(local_170);
  vm_00 = (variables_map *)0x0;
  output = (ostream *)0x0;
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *)0x170957);
  boost::program_options::parse_command_line<char>
            (in_stack_fffffffffffffd7c,in_stack_fffffffffffffd70,
             (options_description *)in_stack_fffffffffffffd68.vm,style,in_stack_fffffffffffffd58);
  boost::program_options::store(local_198,local_170,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options
            ((basic_parsed_options<char> *)0x1709b0);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)0x1709bd);
  boost::program_options::notify(local_170);
  std::allocator<char>::allocator();
  local_202 = 0;
  local_203 = 0;
  std::__cxx11::string::string(local_1d8,"help",&local_1d9);
  sVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  bVar5 = true;
  if (sVar4 == 0) {
    std::allocator<char>::allocator();
    local_202 = 1;
    std::__cxx11::string::string(local_200,"input",&local_201);
    local_203 = 1;
    sVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    bVar5 = sVar4 == 0;
  }
  if ((local_203 & 1) != 0) {
    std::__cxx11::string::~string(local_200);
  }
  if ((local_202 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_201);
  }
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  if (bVar5) {
    this = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,local_90);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    local_4 = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_228,"output",&local_229);
    sVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    std::__cxx11::string::~string(local_228);
    std::allocator<char>::~allocator((allocator<char> *)&local_229);
    if (sVar4 == 0) {
      render_header(output,vm_00);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_270,"output",&local_271);
      boost::program_options::variables_map::operator[]
                ((variables_map *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
      this_00 = boost::program_options::variable_value::as<std::__cxx11::string>
                          ((variable_value *)0x170dac);
      std::__cxx11::string::string(local_250,(string *)this_00);
      std::__cxx11::string::~string(local_270);
      std::allocator<char>::~allocator((allocator<char> *)&local_271);
      std::function<void(std::fstream&)>::function<main::__0,void>
                ((function<void_(std::basic_fstream<char,_std::char_traits<char>_>_&)> *)this_00,
                 (anon_class_8_1_3fcf6775 *)&stack0xfffffffffffffd68);
      open_file(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff00);
      std::function<void_(std::basic_fstream<char,_std::char_traits<char>_>_&)>::~function
                ((function<void_(std::basic_fstream<char,_std::char_traits<char>_>_&)> *)0x170e31);
      std::__cxx11::string::~string(local_250);
    }
    local_4 = 0;
  }
  local_208 = 1;
  boost::program_options::variables_map::~variables_map((variables_map *)in_stack_fffffffffffffc80);
  boost::program_options::options_description::~options_description(in_stack_fffffffffffffc80);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  po::options_description desc("Allowed options");
  desc.add_options()
      ("help,h", "show help")
      ("output,o", po::value<std::string>(),
          "Output file. Leave empty to use stdout.")
      ("namespace,n", po::value<std::string>(),
          "Namespace to put the variables in.")
      ("input,i", po::value<std::vector<std::string>>(),
          "List of files to parse.");
  po::variables_map vm;

  try {
    po::store(po::parse_command_line(argc, argv, desc), vm);
    po::notify(vm);

    if (vm.count("help") || !vm.count("input")) {
      std::cout << desc << std::endl;
      return 1;
    }

    if (vm.count("output")) {
      auto filename = vm["output"].as<std::string>();
      open_file(filename, std::ios::out, [&vm](std::fstream& file) {
        render_header(file, vm);
      });
    } else {
      render_header(std::cout, vm);
    }
  } catch(std::exception& error) {
    std::cerr << error.what() << std::endl;
    return 1;
  }

  return 0;
}